

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O1

void vbyte_encode_u32(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint32_t x)

{
  byte bVar1;
  byte bVar2;
  byte *__args;
  byte bVar3;
  byte bVar4;
  byte local_37 [13];
  byte local_2a;
  byte local_29;
  
  if (x < 0x80) {
    __args = &local_29;
    local_29 = (byte)x;
  }
  else {
    bVar2 = (byte)x | 0x80;
    if (x < 0x4000) {
      local_2a = bVar2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (out,&local_2a);
      bVar2 = (byte)(x >> 7);
      __args = local_37 + 0xc;
    }
    else if (x < 0x200000) {
      local_37[0xb] = bVar2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (out,local_37 + 0xb);
      local_37[10] = (byte)(x >> 7) | 0x80;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (out,local_37 + 10);
      bVar2 = (byte)(x >> 0xe);
      __args = local_37 + 9;
    }
    else {
      bVar3 = (byte)(x >> 7) | 0x80;
      bVar4 = (byte)(x >> 0xe) | 0x80;
      bVar1 = (byte)(x >> 0x15);
      if (x < 0x10000000) {
        local_37[8] = bVar2;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (out,local_37 + 8);
        local_37[7] = bVar3;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (out,local_37 + 7);
        local_37[6] = bVar4;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (out,local_37 + 6);
        __args = local_37 + 5;
        local_37[5] = bVar1;
        goto LAB_0012fe4d;
      }
      local_37[4] = bVar2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (out,local_37 + 4);
      local_37[3] = bVar3;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (out,local_37 + 3);
      local_37[2] = bVar4;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (out,local_37 + 2);
      local_37[1] = bVar1 | 0x80;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (out,local_37 + 1);
      bVar2 = (byte)(x >> 0x1c);
      __args = local_37;
    }
    *__args = bVar2;
  }
LAB_0012fe4d:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (out,__args);
  return;
}

Assistant:

void vbyte_encode_u32(std::vector<uint8_t>& out, uint32_t x)
{
    if (x < (1U << 7)) {
        out.push_back(static_cast<uint8_t>(x & 127));
    } else if (x < (1U << 14)) {
        out.push_back(extract7bits<0>(x) | 128);
        out.push_back(extract7bitsmaskless<1>(x) & 127);
    } else if (x < (1U << 21)) {
        out.push_back(extract7bits<0>(x) | 128);
        out.push_back(extract7bits<1>(x) | 128);
        out.push_back(extract7bitsmaskless<2>(x) & 127);
    } else if (x < (1U << 28)) {
        out.push_back(extract7bits<0>(x) | 128);
        out.push_back(extract7bits<1>(x) | 128);
        out.push_back(extract7bits<2>(x) | 128);
        out.push_back(extract7bitsmaskless<3>(x) & 127);
    } else {
        out.push_back(extract7bits<0>(x) | 128);
        out.push_back(extract7bits<1>(x) | 128);
        out.push_back(extract7bits<2>(x) | 128);
        out.push_back(extract7bits<3>(x) | 128);
        out.push_back(extract7bitsmaskless<4>(x) & 127);
    }
}